

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

uint32_t elf_lzma_len(uchar *compressed,size_t compressed_size,uint16_t *probs,int is_rep,
                     uint pos_state,size_t *poffset,uint32_t *prange,uint32_t *pcode)

{
  int iVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint local_64;
  uint local_54;
  int local_48;
  uint32_t local_44;
  uint32_t len;
  uint32_t bits;
  uint16_t *probs_sym;
  uint16_t *probs_choice;
  size_t *poffset_local;
  uint pos_state_local;
  int is_rep_local;
  uint16_t *probs_local;
  size_t compressed_size_local;
  uchar *compressed_local;
  
  iVar1 = 0x332;
  if (is_rep != 0) {
    iVar1 = 0x534;
  }
  iVar1 = elf_lzma_bit(compressed,compressed_size,probs + iVar1,poffset,prange,pcode);
  if (iVar1 == 0) {
    if (is_rep == 0) {
      local_64 = pos_state * 8 + 0x334;
    }
    else {
      local_64 = pos_state * 8 + 0x536;
    }
    uVar3 = (ulong)local_64;
    local_44 = 3;
    local_48 = 2;
  }
  else {
    iVar1 = 0x333;
    if (is_rep != 0) {
      iVar1 = 0x535;
    }
    iVar1 = elf_lzma_bit(compressed,compressed_size,probs + iVar1,poffset,prange,pcode);
    if (iVar1 == 0) {
      if (is_rep == 0) {
        local_54 = pos_state * 8 + 0x3b4;
      }
      else {
        local_54 = pos_state * 8 + 0x5b6;
      }
      uVar3 = (ulong)local_54;
      local_44 = 3;
      local_48 = 10;
    }
    else {
      iVar1 = 0x434;
      if (is_rep != 0) {
        iVar1 = 0x636;
      }
      uVar3 = (ulong)iVar1;
      local_44 = 8;
      local_48 = 0x12;
    }
  }
  _len = probs + uVar3;
  uVar2 = elf_lzma_integer(compressed,compressed_size,_len,local_44,poffset,prange,pcode);
  return uVar2 + local_48;
}

Assistant:

static uint32_t
elf_lzma_len (const unsigned char *compressed, size_t compressed_size,
	      uint16_t *probs, int is_rep, unsigned int pos_state,
	      size_t *poffset, uint32_t *prange, uint32_t *pcode)
{
  uint16_t *probs_choice;
  uint16_t *probs_sym;
  uint32_t bits;
  uint32_t len;

  probs_choice = probs + (is_rep
			  ? LZMA_REP_LEN_CHOICE
			  : LZMA_MATCH_LEN_CHOICE);
  if (elf_lzma_bit (compressed, compressed_size, probs_choice, poffset,
		    prange, pcode))
    {
      probs_choice = probs + (is_rep
			      ? LZMA_REP_LEN_CHOICE2
			      : LZMA_MATCH_LEN_CHOICE2);
      if (elf_lzma_bit (compressed, compressed_size, probs_choice,
			poffset, prange, pcode))
	{
	  probs_sym = probs + (is_rep
			       ? LZMA_REP_LEN_HIGH (0)
			       : LZMA_MATCH_LEN_HIGH (0));
	  bits = 8;
	  len = 2 + 8 + 8;
	}
      else
	{
	  probs_sym = probs + (is_rep
			       ? LZMA_REP_LEN_MID (pos_state, 0)
			       : LZMA_MATCH_LEN_MID (pos_state, 0));
	  bits = 3;
	  len = 2 + 8;
	}
    }
  else
    {
      probs_sym = probs + (is_rep
			   ? LZMA_REP_LEN_LOW (pos_state, 0)
			   : LZMA_MATCH_LEN_LOW (pos_state, 0));
      bits = 3;
      len = 2;
    }

  len += elf_lzma_integer (compressed, compressed_size, probs_sym, bits,
			   poffset, prange, pcode);
  return len;
}